

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O3

ArrayBuffer<unsigned_char,_1UL,_1UL> * __thiscall
de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
          (ArrayBuffer<unsigned_char,_1UL,_1UL> *this,ArrayBuffer<unsigned_char,_1UL,_1UL> *other)

{
  void *ptr;
  size_t sVar1;
  ArrayBuffer<unsigned_char,_1UL,_1UL> local_20;
  
  ArrayBuffer(&local_20,other);
  ptr = this->m_ptr;
  sVar1 = this->m_cap;
  this->m_ptr = local_20.m_ptr;
  this->m_cap = local_20.m_cap;
  local_20.m_ptr = ptr;
  local_20.m_cap = sVar1;
  detail::ArrayBuffer_AlignedFree(ptr);
  return this;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>& ArrayBuffer<T,Alignment,Stride>::operator= (const ArrayBuffer& other)
{
	ArrayBuffer copied(other);
	swap(copied);
	return *this;
}